

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItaniumDemangle.cpp
# Opt level: O1

void __thiscall
anon_unknown.dwarf_6027d3::StdQualifiedName::printLeft(StdQualifiedName *this,OutputStream *S)

{
  Node *pNVar1;
  
  OutputStream::grow(S,5);
  builtin_strncpy(S->Buffer + S->CurrentPosition,"std::",5);
  S->CurrentPosition = S->CurrentPosition + 5;
  pNVar1 = this->Child;
  (*pNVar1->_vptr_Node[4])(pNVar1,S);
  if (pNVar1->RHSComponentCache == No) {
    return;
  }
  (*pNVar1->_vptr_Node[5])(pNVar1,S);
  return;
}

Assistant:

void printLeft(OutputStream &S) const override {
    S += "std::";
    Child->print(S);
  }